

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

QColor QtMWidgets::darkerColor(QColor *c,int b)

{
  undefined8 uVar1;
  ulong uVar2;
  Spec SVar3;
  undefined1 auVar4 [16];
  QColor QVar5;
  int s;
  int h;
  int a;
  int local_50;
  int local_4c [3];
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  if (b < 1) {
    uVar1 = *(undefined8 *)c;
    uVar2 = *(ulong *)((long)&c->ct + 4);
  }
  else {
    local_4c[0] = 0;
    local_50 = 0;
    local_4c[2] = 0;
    local_4c[1] = 0;
    auVar4 = QColor::toHsv();
    local_40 = auVar4._0_8_;
    local_38 = auVar4._8_4_;
    local_34 = auVar4._12_2_;
    QColor::getHsv((int *)&local_40,local_4c,&local_50,local_4c + 2);
    local_4c[2] = local_4c[2] - b;
    if (local_4c[2] < 1) {
      local_4c[2] = 0;
    }
    SVar3 = (Spec)&local_40;
    QColor::setHsv(SVar3,local_4c[0],local_50,local_4c[2]);
    auVar4 = QColor::convertTo(SVar3);
    uVar1 = auVar4._0_8_;
    uVar2 = auVar4._8_8_ & 0xffffffffffff;
  }
  QVar5._8_8_ = uVar2;
  QVar5._0_8_ = uVar1;
  return QVar5;
}

Assistant:

QColor
darkerColor( const QColor & c, int b )
{
	if( b <= 0 )
		return c;

	int h = 0;
	int s = 0;
	int v = 0;
	int a = 0;

	QColor hsv = c.toHsv();
	hsv.getHsv( &h, &s, &v, &a );

	v -= b;

	if( v < 0 )
		v = 0;

	hsv.setHsv( h, s, v, a );

	return hsv.convertTo( c.spec() );
}